

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsearch_s.c
# Opt level: O3

int main(void)

{
  return 0;
}

Assistant:

int main( void )
{
#if ! defined( REGTEST ) || defined( __STDC_LIB_EXT1__ )
    TESTCASE( bsearch_s( "e", abcde, 4, 1, compare, NULL ) == NULL );
    TESTCASE( bsearch_s( "e", abcde, 5, 1, compare, NULL ) == &abcde[4] );
    TESTCASE( bsearch_s( "a", abcde + 1, 4, 1, compare, NULL ) == NULL );
    TESTCASE( bsearch_s( "0", abcde, 1, 1, compare, NULL ) == NULL );
    TESTCASE( bsearch_s( "a", abcde, 1, 1, compare, NULL ) == &abcde[0] );
    TESTCASE( bsearch_s( "a", abcde, 0, 1, compare, NULL ) == NULL );
    TESTCASE( bsearch_s( "e", abcde, 3, 2, compare, NULL ) == &abcde[4] );
    TESTCASE( bsearch_s( "b", abcde, 3, 2, compare, NULL ) == NULL );
#endif
    return TEST_RESULTS;
}